

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::TopUpChain
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CHDChain *chain,uint kpSize)

{
  CKeyID *a;
  long lVar1;
  WalletStorage *pWVar2;
  unsigned_long parameters_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar3;
  int iVar4;
  long lVar5;
  long parameters_00;
  byte bVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  bool internal;
  long parameters_2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  undefined1 in_stack_ffffffffffffff18 [15];
  long parameters_1;
  CKeyID *b;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  string local_a0;
  CPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock42,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x52c,false);
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[10])
                    ();
  bVar6 = (byte)iVar4;
  if (bVar6 == 0) {
    if (kpSize == 0) {
      kpSize = (uint)this->m_keypool_size;
    }
    uVar10 = (ulong)(kpSize + (kpSize == 0));
    a = &chain->seed_id;
    b = &(this->super_LegacyDataSPKM).m_hd_chain.seed_id;
    bVar3 = ::operator==((base_blob<160U> *)a,(base_blob<160U> *)b);
    if (bVar3) {
      lVar5 = uVar10 - (this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.
                       super__Rb_tree_header._M_node_count;
      parameters_2 = 0;
      if (0 < lVar5) {
        parameters_2 = lVar5;
      }
      lVar5 = uVar10 - (this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.
                       super__Rb_tree_header._M_node_count;
    }
    else {
      lVar5 = (uVar10 - chain->nExternalChainCounter) + chain->m_next_external_index;
      parameters_2 = 0;
      if (0 < lVar5) {
        parameters_2 = lVar5;
      }
      lVar5 = (uVar10 - chain->nInternalChainCounter) + chain->m_next_internal_index;
    }
    parameters_1 = 0;
    if (0 < lVar5) {
      parameters_1 = lVar5;
    }
    iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])(this);
    if (((char)iVar4 == '\0') ||
       (pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage,
       iVar4 = (*pWVar2->_vptr_WalletStorage[6])(pWVar2,0x2227c), (char)iVar4 == '\0')) {
      parameters_1 = 0;
    }
    parameters_00 = parameters_1 + parameters_2;
    lVar5 = parameters_00;
    bVar8 = 0;
    while (lVar7 = lVar5 + -1, lVar5 != 0) {
      bVar9 = bVar8 | lVar5 <= parameters_1;
      internal = (bool)(bVar8 | lVar5 <= parameters_1);
      GenerateNewKey(&pubkey,this,batch,chain,internal);
      bVar3 = ::operator==((base_blob<160U> *)a,(base_blob<160U> *)b);
      lVar5 = lVar7;
      bVar8 = bVar9;
      if (bVar3) {
        AddKeypoolPubkeyWithDB(this,&pubkey,internal,batch);
      }
    }
    if (parameters_00 != 0) {
      bVar8 = bVar6;
      bVar3 = ::operator==((base_blob<160U> *)a,(base_blob<160U> *)b);
      if (bVar3) {
        parameters_3 = (this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.
                       super__Rb_tree_header._M_node_count;
        ScriptPubKeyMan::WalletLogPrintf<long,long,unsigned_long,unsigned_long>
                  ((ScriptPubKeyMan *)this,
                   "keypool added %d keys (%d internal), size=%u (%u internal)\n",parameters_00,
                   parameters_1,
                   (this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.
                   super__Rb_tree_header._M_node_count + parameters_3 +
                   (this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.
                   super__Rb_tree_header._M_node_count,parameters_3);
      }
      else {
        s.m_size = 0x14;
        s.m_data = (uchar *)a;
        HexStr_abi_cxx11_(&local_a0,s);
        parameters._M_string_length._7_1_ = bVar8;
        parameters._0_15_ = in_stack_ffffffffffffff18;
        parameters.field_2._M_allocated_capacity = parameters_1;
        parameters.field_2._8_8_ = b;
        ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string,long,long>
                  ((ScriptPubKeyMan *)this,
                   "inactive seed with id %s added %d external keys, %d internal keys\n",parameters,
                   (long)&local_a0,parameters_2);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock42.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar6 ^ 1);
}

Assistant:

bool LegacyScriptPubKeyMan::TopUpChain(WalletBatch& batch, CHDChain& chain, unsigned int kpSize)
{
    LOCK(cs_KeyStore);

    if (m_storage.IsLocked()) return false;

    // Top up key pool
    unsigned int nTargetSize;
    if (kpSize > 0) {
        nTargetSize = kpSize;
    } else {
        nTargetSize = m_keypool_size;
    }
    int64_t target = std::max((int64_t) nTargetSize, int64_t{1});

    // count amount of available keys (internal, external)
    // make sure the keypool of external and internal keys fits the user selected target (-keypool)
    int64_t missingExternal;
    int64_t missingInternal;
    if (chain == m_hd_chain) {
        missingExternal = std::max(target - (int64_t)setExternalKeyPool.size(), int64_t{0});
        missingInternal = std::max(target - (int64_t)setInternalKeyPool.size(), int64_t{0});
    } else {
        missingExternal = std::max(target - (chain.nExternalChainCounter - chain.m_next_external_index), int64_t{0});
        missingInternal = std::max(target - (chain.nInternalChainCounter - chain.m_next_internal_index), int64_t{0});
    }

    if (!IsHDEnabled() || !m_storage.CanSupportFeature(FEATURE_HD_SPLIT)) {
        // don't create extra internal keys
        missingInternal = 0;
    }
    bool internal = false;
    for (int64_t i = missingInternal + missingExternal; i--;) {
        if (i < missingInternal) {
            internal = true;
        }

        CPubKey pubkey(GenerateNewKey(batch, chain, internal));
        if (chain == m_hd_chain) {
            AddKeypoolPubkeyWithDB(pubkey, internal, batch);
        }
    }
    if (missingInternal + missingExternal > 0) {
        if (chain == m_hd_chain) {
            WalletLogPrintf("keypool added %d keys (%d internal), size=%u (%u internal)\n", missingInternal + missingExternal, missingInternal, setInternalKeyPool.size() + setExternalKeyPool.size() + set_pre_split_keypool.size(), setInternalKeyPool.size());
        } else {
            WalletLogPrintf("inactive seed with id %s added %d external keys, %d internal keys\n", HexStr(chain.seed_id), missingExternal, missingInternal);
        }
    }
    return true;
}